

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O0

bool __thiscall cmParseJacocoCoverage::ReadJacocoXML(cmParseJacocoCoverage *this,char *file)

{
  undefined1 local_b0 [8];
  XMLParser parser;
  char *file_local;
  cmParseJacocoCoverage *this_local;
  
  parser.Coverage = (cmCTestCoverageHandlerContainer *)file;
  XMLParser::XMLParser((XMLParser *)local_b0,this->CTest,this->Coverage);
  cmXMLParser::ParseFile((cmXMLParser *)local_b0,(char *)parser.Coverage);
  XMLParser::~XMLParser((XMLParser *)local_b0);
  return true;
}

Assistant:

bool cmParseJacocoCoverage::ReadJacocoXML(const char* file)
{
  cmParseJacocoCoverage::XMLParser parser(this->CTest, this->Coverage);
  parser.ParseFile(file);
  return true;
}